

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

int mcpl_can_merge(char *file1,char *file2)

{
  int iVar1;
  mcpl_file_t ff1;
  mcpl_file_t ff2;
  mcpl_fileinternal_t *f_1;
  mcpl_fileinternal_t *f;
  int repair_status;
  int repair_status_1;
  int local_20 [2];
  
  local_20[0] = 0;
  ff1 = mcpl_actual_open_file(file1,local_20);
  local_20[1] = 0;
  ff2 = mcpl_actual_open_file(file2,local_20 + 1);
  iVar1 = mcpl_actual_can_merge(ff1,ff2);
  mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff1.internal);
  mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff2.internal);
  return iVar1;
}

Assistant:

int mcpl_can_merge(const char * file1, const char* file2)
{
  mcpl_file_t f1 = mcpl_open_file(file1);
  mcpl_file_t f2 = mcpl_open_file(file2);
  int can_merge = mcpl_actual_can_merge(f1,f2);
  mcpl_close_file(f1);
  mcpl_close_file(f2);
  return can_merge;
}